

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_fprintdot_rec(FILE *out,MDD mdd)

{
  uint8_t uVar1;
  uint32_t uVar2;
  mddnode_t pmVar3;
  uint64_t uVar4;
  MDD right_1;
  MDD down;
  uint32_t val2;
  mddnode_t n2;
  MDD right;
  mddnode_t pmStack_20;
  uint32_t val;
  mddnode_t n;
  MDD mdd_local;
  FILE *out_local;
  
  pmStack_20 = LDD_GETNODE(mdd);
  uVar1 = mddnode_getmark(pmStack_20);
  if (uVar1 == '\0') {
    mddnode_setmark(pmStack_20,'\x01');
    uVar2 = mddnode_getvalue(pmStack_20);
    fprintf((FILE *)out,"%lu [shape=record, label=\"",mdd);
    uVar1 = mddnode_getcopy(pmStack_20);
    if (uVar1 == '\0') {
      fprintf((FILE *)out,"<%u> %u",(ulong)uVar2,(ulong)uVar2);
    }
    else {
      fprintf((FILE *)out,"<c> *");
    }
    n2 = (mddnode_t)mddnode_getright(pmStack_20);
    while (n2 != (mddnode_t)0x0) {
      pmVar3 = LDD_GETNODE((MDD)n2);
      uVar2 = mddnode_getvalue(pmVar3);
      fprintf((FILE *)out,"|<%u> %u",(ulong)uVar2,(ulong)uVar2);
      n2 = (mddnode_t)mddnode_getright(pmVar3);
    }
    fprintf((FILE *)out,"\"];\n");
    while( true ) {
      uVar4 = mddnode_getdown(pmStack_20);
      if (1 < uVar4) {
        lddmc_fprintdot_rec(out,uVar4);
        uVar1 = mddnode_getcopy(pmStack_20);
        if (uVar1 == '\0') {
          uVar2 = mddnode_getvalue(pmStack_20);
          fprintf((FILE *)out,"%lu:%u -> ",mdd,(ulong)uVar2);
        }
        else {
          fprintf((FILE *)out,"%lu:c -> ",mdd);
        }
        pmVar3 = LDD_GETNODE(uVar4);
        uVar1 = mddnode_getcopy(pmVar3);
        if (uVar1 == '\0') {
          pmVar3 = LDD_GETNODE(uVar4);
          uVar2 = mddnode_getvalue(pmVar3);
          fprintf((FILE *)out,"%lu:%u [style=solid];\n",uVar4,(ulong)uVar2);
        }
        else {
          fprintf((FILE *)out,"%lu:c [style=solid];\n",uVar4);
        }
      }
      uVar4 = mddnode_getright(pmStack_20);
      if (uVar4 == 0) break;
      pmStack_20 = LDD_GETNODE(uVar4);
    }
  }
  return;
}

Assistant:

static void
lddmc_fprintdot_rec(FILE* out, MDD mdd)
{
    // assert(mdd > lddmc_true);

    // check mark
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) return;
    mddnode_setmark(n, 1);

    // print the node
    uint32_t val = mddnode_getvalue(n);
    fprintf(out, "%" PRIu64 " [shape=record, label=\"", mdd);
    if (mddnode_getcopy(n)) fprintf(out, "<c> *");
    else fprintf(out, "<%u> %u", val, val);
    MDD right = mddnode_getright(n);
    while (right != lddmc_false) {
        mddnode_t n2 = LDD_GETNODE(right);
        uint32_t val2 = mddnode_getvalue(n2);
        fprintf(out, "|<%u> %u", val2, val2);
        right = mddnode_getright(n2);
        // assert(right != lddmc_true);
    }
    fprintf(out, "\"];\n");

    // recurse and print the edges
    for (;;) {
        MDD down = mddnode_getdown(n);
        // assert(down != lddmc_false);
        if (down > lddmc_true) {
            lddmc_fprintdot_rec(out, down);
            if (mddnode_getcopy(n)) {
                fprintf(out, "%" PRIu64 ":c -> ", mdd);
            } else {
                fprintf(out, "%" PRIu64 ":%u -> ", mdd, mddnode_getvalue(n));
            }
            if (mddnode_getcopy(LDD_GETNODE(down))) {
                fprintf(out, "%" PRIu64 ":c [style=solid];\n", down);
            } else {
                fprintf(out, "%" PRIu64 ":%u [style=solid];\n", down, mddnode_getvalue(LDD_GETNODE(down)));
            }
        }
        MDD right = mddnode_getright(n);
        if (right == lddmc_false) break;
        n = LDD_GETNODE(right);
    }
}